

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.hpp
# Opt level: O2

void __thiscall Shader::Shader(Shader *this,char *vertexPath,char *fragmentPath,char *geometryPath)

{
  GLuint shader;
  GLuint shader_00;
  GLuint shader_01;
  GLuint GVar1;
  string geometryCode;
  string fragmentCode;
  string vertexCode;
  string local_b80;
  string local_b60;
  string local_b40;
  string local_b20;
  string local_b00 [32];
  stringstream gShaderStream;
  ostream local_ad0 [376];
  failure e;
  ostream local_948 [376];
  char *fShaderCode;
  ostream local_7c0 [376];
  ifstream gShaderFile;
  streambuf local_638 [504];
  ifstream fShaderFile;
  streambuf local_430 [504];
  ifstream vShaderFile;
  streambuf local_228 [504];
  
  vertexCode._M_dataplus._M_p = (pointer)&vertexCode.field_2;
  vertexCode._M_string_length = 0;
  fragmentCode._M_dataplus._M_p = (pointer)&fragmentCode.field_2;
  fragmentCode._M_string_length = 0;
  vertexCode.field_2._M_local_buf[0] = '\0';
  fragmentCode.field_2._M_local_buf[0] = '\0';
  geometryCode._M_dataplus._M_p = (pointer)&geometryCode.field_2;
  geometryCode._M_string_length = 0;
  geometryCode.field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&vShaderFile);
  std::ifstream::ifstream(&fShaderFile);
  std::ifstream::ifstream(&gShaderFile);
  std::ios::exceptions((int)&vShaderFile + (int)*(undefined8 *)(_vShaderFile + -0x18));
  std::ios::exceptions((int)&fShaderFile + (int)*(undefined8 *)(_fShaderFile + -0x18));
  std::ios::exceptions((int)&gShaderFile + (int)*(undefined8 *)(_gShaderFile + -0x18));
  std::ifstream::open((char *)&vShaderFile,(_Ios_Openmode)vertexPath);
  std::ifstream::open((char *)&fShaderFile,(_Ios_Openmode)fragmentPath);
  std::__cxx11::stringstream::stringstream((stringstream *)&e);
  std::__cxx11::stringstream::stringstream((stringstream *)&fShaderCode);
  std::ostream::operator<<(local_948,local_228);
  std::ostream::operator<<(local_7c0,local_430);
  std::ifstream::close();
  std::ifstream::close();
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&vertexCode,(string *)&gShaderStream);
  std::__cxx11::string::~string((string *)&gShaderStream);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&fragmentCode,(string *)&gShaderStream);
  std::__cxx11::string::~string((string *)&gShaderStream);
  if (geometryPath != (char *)0x0) {
    std::ifstream::open((char *)&gShaderFile,(_Ios_Openmode)geometryPath);
    std::__cxx11::stringstream::stringstream((stringstream *)&gShaderStream);
    std::ostream::operator<<(local_ad0,local_638);
    std::ifstream::close();
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&geometryCode,local_b00);
    std::__cxx11::string::~string(local_b00);
    std::__cxx11::stringstream::~stringstream((stringstream *)&gShaderStream);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&fShaderCode);
  std::__cxx11::stringstream::~stringstream((stringstream *)&e);
  _e = vertexCode._M_dataplus._M_p;
  fShaderCode = fragmentCode._M_dataplus._M_p;
  shader_01 = 0x1b85a8;
  shader = (*glad_glCreateShader)(0x8b31);
  (*glad_glShaderSource)(shader,1,(GLchar **)&e,(GLint *)0x0);
  (*glad_glCompileShader)(shader);
  std::__cxx11::string::string((string *)&local_b20,"VERTEX",(allocator *)&gShaderStream);
  checkCompileErrors(this,shader,&local_b20);
  std::__cxx11::string::~string((string *)&local_b20);
  shader_00 = (*glad_glCreateShader)(0x8b30);
  (*glad_glShaderSource)(shader_00,1,&fShaderCode,(GLint *)0x0);
  (*glad_glCompileShader)(shader_00);
  std::__cxx11::string::string((string *)&local_b40,"FRAGMENT",(allocator *)&gShaderStream);
  checkCompileErrors(this,shader_00,&local_b40);
  std::__cxx11::string::~string((string *)&local_b40);
  if (geometryPath != (char *)0x0) {
    _gShaderStream = geometryCode._M_dataplus._M_p;
    shader_01 = (*glad_glCreateShader)(0x8dd9);
    (*glad_glShaderSource)(shader_01,1,(GLchar **)&gShaderStream,(GLint *)0x0);
    (*glad_glCompileShader)(shader_01);
    std::__cxx11::string::string((string *)&local_b60,"GEOMETRY",(allocator *)local_b00);
    checkCompileErrors(this,shader_01,&local_b60);
    std::__cxx11::string::~string((string *)&local_b60);
  }
  GVar1 = (*glad_glCreateProgram)();
  this->ID = GVar1;
  (*glad_glAttachShader)(GVar1,shader);
  (*glad_glAttachShader)(this->ID,shader_00);
  if (geometryPath != (char *)0x0) {
    (*glad_glAttachShader)(this->ID,shader_01);
  }
  (*glad_glLinkProgram)(this->ID);
  GVar1 = this->ID;
  std::__cxx11::string::string((string *)&local_b80,"PROGRAM",(allocator *)&gShaderStream);
  checkCompileErrors(this,GVar1,&local_b80);
  std::__cxx11::string::~string((string *)&local_b80);
  (*glad_glDeleteShader)(shader);
  (*glad_glDeleteShader)(shader_00);
  if (geometryPath != (char *)0x0) {
    (*glad_glDeleteShader)(shader_01);
  }
  std::ifstream::~ifstream(&gShaderFile);
  std::ifstream::~ifstream(&fShaderFile);
  std::ifstream::~ifstream(&vShaderFile);
  std::__cxx11::string::~string((string *)&geometryCode);
  std::__cxx11::string::~string((string *)&fragmentCode);
  std::__cxx11::string::~string((string *)&vertexCode);
  return;
}

Assistant:

Shader(const char* vertexPath, const char* fragmentPath, const char* geometryPath = nullptr) {
        // 1. retrieve the vertex/fragment source code from filePath
        std::string vertexCode;
        std::string fragmentCode;
        std::string geometryCode;
        std::ifstream vShaderFile;
        std::ifstream fShaderFile;
        std::ifstream gShaderFile;
        // ensure ifstream objects can throw exceptions:
        vShaderFile.exceptions (std::ifstream::failbit | std::ifstream::badbit);
        fShaderFile.exceptions (std::ifstream::failbit | std::ifstream::badbit);
        gShaderFile.exceptions (std::ifstream::failbit | std::ifstream::badbit);
        try {
            // open files
            vShaderFile.open(vertexPath);
            fShaderFile.open(fragmentPath);
            std::stringstream vShaderStream, fShaderStream;
            // read file's buffer contents into streams
            vShaderStream << vShaderFile.rdbuf();
            fShaderStream << fShaderFile.rdbuf();		
            // close file handlers
            vShaderFile.close();
            fShaderFile.close();
            // convert stream into string
            vertexCode = vShaderStream.str();
            fragmentCode = fShaderStream.str();			
            // if geometry shader path is present, also load a geometry shader
            if(geometryPath != nullptr)
            {
                gShaderFile.open(geometryPath);
                std::stringstream gShaderStream;
                gShaderStream << gShaderFile.rdbuf();
                gShaderFile.close();
                geometryCode = gShaderStream.str();
            }
        } catch (std::ifstream::failure e) {
            std::cout << "ERROR::SHADER::FILE_NOT_SUCCESFULLY_READ" << std::endl;
        }
        const char* vShaderCode = vertexCode.c_str();
        const char * fShaderCode = fragmentCode.c_str();
        // 2. compile shaders
        unsigned int vertex, fragment;
        // vertex shader
        vertex = glCreateShader(GL_VERTEX_SHADER);
        glShaderSource(vertex, 1, &vShaderCode, NULL);
        glCompileShader(vertex);
        checkCompileErrors(vertex, "VERTEX");
        // fragment Shader
        fragment = glCreateShader(GL_FRAGMENT_SHADER);
        glShaderSource(fragment, 1, &fShaderCode, NULL);
        glCompileShader(fragment);
        checkCompileErrors(fragment, "FRAGMENT");
        // if geometry shader is given, compile geometry shader
        unsigned int geometry;
        if(geometryPath != nullptr) {
            const char * gShaderCode = geometryCode.c_str();
            geometry = glCreateShader(GL_GEOMETRY_SHADER);
            glShaderSource(geometry, 1, &gShaderCode, NULL);
            glCompileShader(geometry);
            checkCompileErrors(geometry, "GEOMETRY");
        }
        // shader Program
        ID = glCreateProgram();
        glAttachShader(ID, vertex);
        glAttachShader(ID, fragment);
        if(geometryPath != nullptr)
            glAttachShader(ID, geometry);
        glLinkProgram(ID);
        checkCompileErrors(ID, "PROGRAM");
        // delete the shaders as they're linked into our program now and no longer necessery
        glDeleteShader(vertex);
        glDeleteShader(fragment);
        if(geometryPath != nullptr)
            glDeleteShader(geometry);

    }